

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_IterSmallAndLargeMix::_Run(_Test_IterSmallAndLargeMix *this)

{
  DB *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 local_20c8 [448];
  undefined1 local_1f08 [455];
  allocator local_1d41;
  string local_1d40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d20 [32];
  undefined1 local_1d00 [448];
  undefined1 local_1b40 [455];
  allocator local_1979;
  string local_1978 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1958 [32];
  undefined1 local_1938 [455];
  allocator local_1771;
  string local_1770 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1750 [32];
  undefined1 local_1730 [448];
  undefined1 local_1570 [455];
  allocator local_13a9;
  string local_13a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1388 [32];
  undefined1 local_1368 [455];
  allocator local_11a1;
  string local_11a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1180 [32];
  undefined1 local_1160 [448];
  undefined1 local_fa0 [455];
  allocator local_dd9;
  string local_dd8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db8 [32];
  undefined1 local_d98 [448];
  undefined1 local_bd8 [448];
  ReadOptions local_a18;
  long *local_a00;
  Iterator *iter;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [32];
  undefined1 local_9a8 [431];
  allocator local_7f9;
  string local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [32];
  undefined1 local_7b0 [431];
  allocator local_601;
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [32];
  undefined1 local_5b8 [431];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  undefined1 local_3c0 [431];
  allocator local_211;
  string local_210 [55];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [424];
  _Test_IterSmallAndLargeMix *local_10;
  _Test_IterSmallAndLargeMix *this_local;
  
  local_10 = this;
  test::Tester::Tester
            ((Tester *)(local_1b8 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x38e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"a",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"va",&local_211);
  DBTest::Put((DBTest *)local_1b8,(string *)this,(string *)local_1d8);
  test::Tester::IsOk((Tester *)(local_1b8 + 8),(Status *)local_1b8);
  Status::~Status((Status *)local_1b8);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  test::Tester::~Tester((Tester *)(local_1b8 + 8));
  test::Tester::Tester
            ((Tester *)(local_3c0 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x38f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"b",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,100000,'b',&local_409);
  DBTest::Put((DBTest *)local_3c0,(string *)this,(string *)local_3e0);
  test::Tester::IsOk((Tester *)(local_3c0 + 8),(Status *)local_3c0);
  Status::~Status((Status *)local_3c0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  test::Tester::~Tester((Tester *)(local_3c0 + 8));
  test::Tester::Tester
            ((Tester *)(local_5b8 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"c",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"vc",&local_601);
  DBTest::Put((DBTest *)local_5b8,(string *)this,(string *)local_5d8);
  test::Tester::IsOk((Tester *)(local_5b8 + 8),(Status *)local_5b8);
  Status::~Status((Status *)local_5b8);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  test::Tester::~Tester((Tester *)(local_5b8 + 8));
  test::Tester::Tester
            ((Tester *)(local_7b0 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d0,"d",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,100000,'d',&local_7f9);
  DBTest::Put((DBTest *)local_7b0,(string *)this,(string *)local_7d0);
  test::Tester::IsOk((Tester *)(local_7b0 + 8),(Status *)local_7b0);
  Status::~Status((Status *)local_7b0);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  test::Tester::~Tester((Tester *)(local_7b0 + 8));
  test::Tester::Tester
            ((Tester *)(local_9a8 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x392);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"e",&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,100000,'e',(allocator *)((long)&iter + 7));
  DBTest::Put((DBTest *)local_9a8,(string *)this,(string *)local_9c8);
  test::Tester::IsOk((Tester *)(local_9a8 + 8),(Status *)local_9a8);
  Status::~Status((Status *)local_9a8);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&iter + 7));
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  test::Tester::~Tester((Tester *)(local_9a8 + 8));
  pDVar1 = (this->super_DBTest).db_;
  local_a18.verify_checksums = false;
  local_a18.fill_cache = false;
  local_a18._2_6_ = 0;
  local_a18.snapshot = (Snapshot *)0x0;
  ReadOptions::ReadOptions(&local_a18);
  iVar2 = (*pDVar1->_vptr_DB[6])(pDVar1,&local_a18);
  local_a00 = (long *)CONCAT44(extraout_var,iVar2);
  (**(code **)(*local_a00 + 0x18))();
  test::Tester::Tester
            ((Tester *)(local_bd8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x397);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_bd8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_bd8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bd8,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_bd8);
  test::Tester::~Tester((Tester *)(local_bd8 + 0x20));
  (**(code **)(*local_a00 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_d98 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x399);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_d98,(Iterator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd8,100000,'b',&local_dd9);
  std::operator+((char *)local_db8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"b->");
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)(local_d98 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d98,
             local_db8);
  std::__cxx11::string::~string((string *)local_db8);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
  std::__cxx11::string::~string((string *)local_d98);
  test::Tester::~Tester((Tester *)(local_d98 + 0x20));
  (**(code **)(*local_a00 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_fa0 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x39b);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_fa0,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_fa0 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0,
             (char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)local_fa0);
  test::Tester::~Tester((Tester *)(local_fa0 + 0x20));
  (**(code **)(*local_a00 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_1160 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x39d);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1160,(Iterator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11a0,100000,'d',&local_11a1);
  std::operator+((char *)local_1180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"d->");
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)(local_1160 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1160,
             local_1180);
  std::__cxx11::string::~string((string *)local_1180);
  std::__cxx11::string::~string(local_11a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
  std::__cxx11::string::~string((string *)local_1160);
  test::Tester::~Tester((Tester *)(local_1160 + 0x20));
  (**(code **)(*local_a00 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_1368 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x39f);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1368,(Iterator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13a8,100000,'e',&local_13a9);
  std::operator+((char *)local_1388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"e->");
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)(local_1368 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1368,
             local_1388);
  std::__cxx11::string::~string((string *)local_1388);
  std::__cxx11::string::~string(local_13a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13a9);
  std::__cxx11::string::~string((string *)local_1368);
  test::Tester::~Tester((Tester *)(local_1368 + 0x20));
  (**(code **)(*local_a00 + 0x30))();
  test::Tester::Tester
            ((Tester *)(local_1570 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3a1);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1570,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1570 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1570,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_1570);
  test::Tester::~Tester((Tester *)(local_1570 + 0x20));
  (**(code **)(*local_a00 + 0x20))();
  test::Tester::Tester
            ((Tester *)(local_1730 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3a4);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1730,(Iterator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1770,100000,'e',&local_1771);
  std::operator+((char *)local_1750,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"e->");
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)(local_1730 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1730,
             local_1750);
  std::__cxx11::string::~string((string *)local_1750);
  std::__cxx11::string::~string(local_1770);
  std::allocator<char>::~allocator((allocator<char> *)&local_1771);
  std::__cxx11::string::~string((string *)local_1730);
  test::Tester::~Tester((Tester *)(local_1730 + 0x20));
  (**(code **)(*local_a00 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_1938 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3a6);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1938,(Iterator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1978,100000,'d',&local_1979);
  std::operator+((char *)local_1958,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"d->");
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)(local_1938 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1938,
             local_1958);
  std::__cxx11::string::~string((string *)local_1958);
  std::__cxx11::string::~string(local_1978);
  std::allocator<char>::~allocator((allocator<char> *)&local_1979);
  std::__cxx11::string::~string((string *)local_1938);
  test::Tester::~Tester((Tester *)(local_1938 + 0x20));
  (**(code **)(*local_a00 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_1b40 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3a8);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1b40,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1b40 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b40,
             (char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)local_1b40);
  test::Tester::~Tester((Tester *)(local_1b40 + 0x20));
  (**(code **)(*local_a00 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_1d00 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3aa);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1d00,(Iterator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d40,100000,'b',&local_1d41);
  std::operator+((char *)local_1d20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"b->");
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            ((Tester *)(local_1d00 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d00,
             local_1d20);
  std::__cxx11::string::~string((string *)local_1d20);
  std::__cxx11::string::~string(local_1d40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d41);
  std::__cxx11::string::~string((string *)local_1d00);
  test::Tester::~Tester((Tester *)(local_1d00 + 0x20));
  (**(code **)(*local_a00 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_1f08 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3ac);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_1f08,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1f08 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f08,
             (char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)local_1f08);
  test::Tester::~Tester((Tester *)(local_1f08 + 0x20));
  (**(code **)(*local_a00 + 0x38))();
  test::Tester::Tester
            ((Tester *)(local_20c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x3ae);
  DBTest::IterStatus_abi_cxx11_((DBTest *)local_20c8,(Iterator *)this);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_20c8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20c8,
             (char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)local_20c8);
  test::Tester::~Tester((Tester *)(local_20c8 + 0x20));
  if (local_a00 != (long *)0x0) {
    (**(code **)(*local_a00 + 8))();
  }
  return;
}

Assistant:

TEST(DBTest, IterSmallAndLargeMix) {
  ASSERT_OK(Put("a", "va"));
  ASSERT_OK(Put("b", std::string(100000, 'b')));
  ASSERT_OK(Put("c", "vc"));
  ASSERT_OK(Put("d", std::string(100000, 'd')));
  ASSERT_OK(Put("e", std::string(100000, 'e')));

  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->" + std::string(100000, 'b'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "d->" + std::string(100000, 'd'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "e->" + std::string(100000, 'e'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "e->" + std::string(100000, 'e'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "d->" + std::string(100000, 'd'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->" + std::string(100000, 'b'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}